

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordQueryReliablePdu.cpp
# Opt level: O1

int __thiscall DIS::RecordQueryReliablePdu::getMarshalledSize(RecordQueryReliablePdu *this)

{
  int iVar1;
  int iVar2;
  pointer pFVar3;
  long lVar4;
  ulong uVar5;
  FourByteChunk listElement;
  FourByteChunk local_40;
  
  iVar1 = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize
                    (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  iVar1 = iVar1 + 0x12;
  pFVar3 = (this->_recordIDs).
           super__Vector_base<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_recordIDs).super__Vector_base<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>
      ._M_impl.super__Vector_impl_data._M_finish != pFVar3) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      local_40._vptr_FourByteChunk = (_func_int **)&PTR__FourByteChunk_001b4cb0;
      local_40._otherParameters = *(char (*) [4])(pFVar3->_otherParameters + lVar4 + -8);
      iVar2 = FourByteChunk::getMarshalledSize(&local_40);
      iVar1 = iVar1 + iVar2;
      FourByteChunk::~FourByteChunk(&local_40);
      uVar5 = uVar5 + 1;
      pFVar3 = (this->_recordIDs).
               super__Vector_base<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < (ulong)((long)(this->_recordIDs).
                                   super__Vector_base<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar3 >> 4));
  }
  return iVar1;
}

Assistant:

int RecordQueryReliablePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + 4;  // _requestID
   marshalSize = marshalSize + 1;  // _requiredReliabilityService
   marshalSize = marshalSize + 2;  // _pad1
   marshalSize = marshalSize + 1;  // _pad2
   marshalSize = marshalSize + 2;  // _eventType
   marshalSize = marshalSize + 4;  // _time
   marshalSize = marshalSize + 4;  // _numberOfRecords

   for(unsigned long long idx=0; idx < _recordIDs.size(); idx++)
   {
        FourByteChunk listElement = _recordIDs[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}